

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superscalar.cpp
# Opt level: O2

bool __thiscall
randomx::SuperscalarInstruction::selectDestination
          (SuperscalarInstruction *this,int cycle,bool allowChainedMul,RegisterInfo (*registers) [8]
          ,Blake2Generator *gen)

{
  bool bVar1;
  ulong uVar2;
  int *piVar3;
  vector<int,_std::allocator<int>_> availableRegisters;
  int local_54;
  Blake2Generator *local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  piVar3 = &(*registers)[0].lastOpPar;
  local_50 = gen;
  for (uVar2 = 0; uVar2 != 8; uVar2 = uVar2 + 1) {
    if ((((RegisterInfo *)(piVar3 + -2))->latency <= cycle) &&
       ((this->canReuse_ != false || (uVar2 != (uint)this->src_)))) {
      if (((this->opGroup_ != IMUL_R || allowChainedMul) || piVar3[-1] != IMUL_R) &&
         (((piVar3[-1] != this->opGroup_ || (*piVar3 != this->opGroupPar_)) &&
          ((uVar2 != 5 || (this->info_->type_ != IADD_RS)))))) {
        local_54 = (int)uVar2;
        std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)&local_48,&local_54);
      }
    }
    piVar3 = piVar3 + 4;
  }
  bVar1 = selectRegister((vector<int,_std::allocator<int>_> *)&local_48,local_50,&this->dst_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return bVar1;
}

Assistant:

bool selectDestination(int cycle, bool allowChainedMul, RegisterInfo (&registers)[8], Blake2Generator& gen) {
			/*if (allowChainedMultiplication && opGroup_ == SuperscalarInstructionType::IMUL_R)
				std::cout << "Selecting destination with chained MUL enabled" << std::endl;*/
			std::vector<int> availableRegisters;
			//Conditions for the destination register:
			// * value must be ready at the required cycle
			// * cannot be the same as the source register unless the instruction allows it
			//   - this avoids optimizable instructions such as "xor r, r" or "sub r, r"
			// * register cannot be multiplied twice in a row unless allowChainedMul is true 
			//   - this avoids accumulation of trailing zeroes in registers due to excessive multiplication
			//   - allowChainedMul is set to true if an attempt to find source/destination registers failed (this is quite rare, but prevents a catastrophic failure of the generator)
			// * either the last instruction applied to the register or its source must be different than this instruction
			//   - this avoids optimizable instruction sequences such as "xor r1, r2; xor r1, r2" or "ror r, C1; ror r, C2" or "add r, C1; add r, C2"
			// * register r5 cannot be the destination of the IADD_RS instruction (limitation of the x86 lea instruction)
			for (unsigned i = 0; i < 8; ++i) {
				if (registers[i].latency <= cycle && (canReuse_ || i != src_) && (allowChainedMul || opGroup_ != SuperscalarInstructionType::IMUL_R || registers[i].lastOpGroup != SuperscalarInstructionType::IMUL_R) && (registers[i].lastOpGroup != opGroup_ || registers[i].lastOpPar != opGroupPar_) && (info_->getType() != SuperscalarInstructionType::IADD_RS || i != RegisterNeedsDisplacement))
					availableRegisters.push_back(i);
			}
			return selectRegister(availableRegisters, gen, dst_);
		}